

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLAES.cpp
# Opt level: O0

bool __thiscall
OSSLAES::wrapUnwrapKey
          (OSSLAES *this,SymmetricKey *key,Type mode,ByteString *in,ByteString *out,int wrap)

{
  EVP_CIPHER *cipher_00;
  uchar *puVar1;
  ByteString *this_00;
  uchar *in_00;
  size_t sVar2;
  long *in_RSI;
  int in_R9D;
  int curBlockLen;
  int outLen;
  int rv;
  EVP_CIPHER_CTX *pWrapCTX;
  EVP_CIPHER *cipher;
  char *prefix;
  EVP_CIPHER_CTX *in_stack_ffffffffffffff58;
  SymmetricKey *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  EVP_CIPHER_CTX *pEVar3;
  OSSLAES *in_stack_ffffffffffffff78;
  int local_5c;
  int local_58;
  int local_54;
  EVP_CIPHER_CTX *local_50;
  EVP_CIPHER *local_48;
  char *local_40;
  int local_34;
  long *local_18;
  bool local_1;
  
  local_40 = "";
  if (in_R9D == 0) {
    local_40 = "un";
  }
  local_34 = in_R9D;
  local_18 = in_RSI;
  local_48 = (EVP_CIPHER *)
             getWrapCipher(in_stack_ffffffffffffff78,
                           (Type)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                           in_stack_ffffffffffffff68);
  if (local_48 == (EVP_CIPHER *)0x0) {
    softHSMLog(3,"wrapUnwrapKey",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLAES.cpp"
               ,0x9a,"Failed to get EVP %swrap cipher",local_40);
    local_1 = false;
  }
  else {
    local_50 = EVP_CIPHER_CTX_new();
    if (local_50 == (EVP_CIPHER_CTX *)0x0) {
      softHSMLog(3,"wrapUnwrapKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLAES.cpp"
                 ,0xa2,"Failed to allocate space for EVP_CIPHER_CTX");
      local_1 = false;
    }
    else {
      EVP_CIPHER_CTX_set_flags(local_50,1);
      cipher_00 = local_48;
      pEVar3 = local_50;
      (**(code **)(*local_18 + 0x20))();
      puVar1 = ByteString::const_byte_str((ByteString *)in_stack_ffffffffffffff58);
      local_54 = EVP_CipherInit_ex(pEVar3,cipher_00,(ENGINE *)0x0,puVar1,(uchar *)0x0,local_34);
      if (local_54 != 0) {
        local_54 = EVP_CIPHER_CTX_set_padding(local_50,0);
      }
      if (local_54 == 0) {
        softHSMLog(3,"wrapUnwrapKey",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLAES.cpp"
                   ,0xad,"Failed to initialise EVP cipher %swrap operation",local_40);
        EVP_CIPHER_CTX_free(local_50);
        local_1 = false;
      }
      else {
        this_00 = (ByteString *)ByteString::size((ByteString *)0x1aa502);
        EVP_CIPHER_CTX_get_block_size(local_50);
        ByteString::resize(this_00,(size_t)in_stack_ffffffffffffff58);
        local_58 = 0;
        local_5c = 0;
        pEVar3 = local_50;
        puVar1 = ByteString::operator[](this_00,(size_t)in_stack_ffffffffffffff58);
        in_00 = ByteString::const_byte_str((ByteString *)in_stack_ffffffffffffff58);
        sVar2 = ByteString::size((ByteString *)0x1aa577);
        local_54 = EVP_CipherUpdate(pEVar3,puVar1,&local_5c,in_00,(int)sVar2);
        if (local_54 == 1) {
          local_58 = local_5c;
          in_stack_ffffffffffffff58 = local_50;
          puVar1 = ByteString::operator[](this_00,(size_t)local_50);
          local_54 = EVP_CipherFinal_ex(in_stack_ffffffffffffff58,puVar1 + local_58,&local_5c);
        }
        if (local_54 == 1) {
          EVP_CIPHER_CTX_free(local_50);
          local_58 = local_5c + local_58;
          ByteString::resize(this_00,(size_t)in_stack_ffffffffffffff58);
          local_1 = true;
        }
        else {
          softHSMLog(3,"wrapUnwrapKey",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLAES.cpp"
                     ,0xbe,"Failed EVP %swrap operation",local_40);
          EVP_CIPHER_CTX_free(local_50);
          local_1 = false;
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool OSSLAES::wrapUnwrapKey(const SymmetricKey* key, const SymWrap::Type mode, const ByteString& in, ByteString& out, const int wrap) const
{
	const char *prefix = "";
	if (wrap == 0)
		prefix = "un";

	// Determine the cipher method
	const EVP_CIPHER* cipher = getWrapCipher(mode, key);
	if (cipher == NULL)
	{
		ERROR_MSG("Failed to get EVP %swrap cipher", prefix);
		return false;
	}

	// Allocate the EVP context
	EVP_CIPHER_CTX* pWrapCTX = EVP_CIPHER_CTX_new();
	if (pWrapCTX == NULL)
	{
		ERROR_MSG("Failed to allocate space for EVP_CIPHER_CTX");
		return false;
	}
	EVP_CIPHER_CTX_set_flags(pWrapCTX, EVP_CIPHER_CTX_FLAG_WRAP_ALLOW);

	int rv = EVP_CipherInit_ex(pWrapCTX, cipher, NULL, (unsigned char*) key->getKeyBits().const_byte_str(), NULL, wrap);
	if (rv)
		// Padding is handled by cipher mode separately
		rv = EVP_CIPHER_CTX_set_padding(pWrapCTX, 0);
	if (!rv)
	{
		ERROR_MSG("Failed to initialise EVP cipher %swrap operation", prefix);

		EVP_CIPHER_CTX_free(pWrapCTX);
		return false;
	}

	// 1 input byte could be expanded to two AES blocks
	out.resize(in.size() + 2 * EVP_CIPHER_CTX_block_size(pWrapCTX) - 1);
	int outLen = 0;
	int curBlockLen = 0;
	rv = EVP_CipherUpdate(pWrapCTX, &out[0], &curBlockLen, in.const_byte_str(), in.size());
	if (rv == 1) {
		outLen = curBlockLen;
		rv = EVP_CipherFinal_ex(pWrapCTX, &out[0] + outLen, &curBlockLen);
	}
	if (rv != 1)
	{
		ERROR_MSG("Failed EVP %swrap operation", prefix);

		EVP_CIPHER_CTX_free(pWrapCTX);
		return false;
	}
	EVP_CIPHER_CTX_free(pWrapCTX);
	outLen += curBlockLen;
	out.resize(outLen);
	return true;
}